

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterHasNoReset.cpp
# Opt level: O1

void __thiscall
register_has_no_reset::AlwaysFFVisitor::handle
          (AlwaysFFVisitor *this,ConditionalStatement *statement)

{
  AlwaysFFVisitor AVar1;
  int iVar2;
  size_t sVar3;
  pointer pCVar4;
  Expression *this_00;
  int *piVar5;
  Statement *pSVar6;
  bool bVar7;
  char cVar8;
  long lVar9;
  bool bVar10;
  Statement *this_01;
  Statement *this_02;
  LookupIdentifier lookupIdentifierVisitor;
  LookupLhsIdentifier visitor;
  LookupIdentifier local_88;
  LookupLhsIdentifier local_58;
  
  if (statement->ifFalse != (Statement *)0x0) {
    local_88.name._M_len = *(size_t *)(this + 0x10);
    local_88.name._M_str = *(char **)(this + 0x18);
    local_88.exactMatching = false;
    local_88._found = false;
    local_88._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._M_engaged = false;
    sVar3 = (statement->conditions)._M_extent._M_extent_value;
    if (sVar3 == 0) {
      bVar10 = false;
      cVar8 = '\0';
    }
    else {
      pCVar4 = (statement->conditions)._M_ptr;
      lVar9 = 0;
      bVar10 = false;
      do {
        this_00 = *(Expression **)((long)&(pCVar4->expr).ptr + lVar9);
        slang::ast::Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
                  (this_00,this_00,&local_88);
        if ((local_88._found == true) &&
           (piVar5 = *(int **)((long)&(pCVar4->expr).ptr + lVar9), *piVar5 == 10)) {
          iVar2 = piVar5[0xc];
          bVar10 = iVar2 == 9 || iVar2 == 2;
        }
        cVar8 = local_88._found;
        if (local_88._found != false) goto LAB_001bfeb4;
        lVar9 = lVar9 + 0x10;
      } while (sVar3 << 4 != lVar9);
      cVar8 = '\0';
    }
LAB_001bfeb4:
    if (cVar8 != '\0') {
      this_02 = statement->ifTrue;
      pSVar6 = statement->ifFalse;
      AVar1 = this[0x20];
      this_01 = pSVar6;
      if (((bVar10 ^ (byte)AVar1) & 1) != 0) {
        this_01 = this_02;
      }
      local_58.name._M_len = *(size_t *)this;
      local_58.name._M_str = *(char **)(this + 8);
      local_58._found = false;
      local_58._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceLocation>._M_engaged = false;
      slang::ast::Statement::visit<LookupLhsIdentifier&>(this_01,&local_58);
      bVar7 = local_58._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::SourceLocation>._M_engaged;
      if (local_58._found == true) {
        if (((bVar10 ^ (byte)AVar1) & 1) != 0) {
          this_02 = pSVar6;
        }
        local_58._found = false;
        local_58._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceLocation>._M_engaged = false;
        slang::ast::Statement::visit<LookupLhsIdentifier&>(this_02,&local_58);
        if (local_58._found == false) {
          this[0x21] = (AlwaysFFVisitor)0x1;
          *(_Storage<slang::SourceLocation,_true> *)(this + 0x28) =
               local_58._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>.
               _M_payload.super__Optional_payload_base<slang::SourceLocation>._M_payload;
          this[0x30] = (AlwaysFFVisitor)bVar7;
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const ConditionalStatement& statement) {
        // Early return, if there's no else clause on the conditional statement
        if (!statement.ifFalse) {
            return;
        }

        // Check if there is a reset in the conditional statement and if the signal is negated
        bool isReset = false;
        bool isResetNeg = false;

        LookupIdentifier lookupIdentifierVisitor(resetName, false);
        for (const auto& condition : statement.conditions) {
            condition.expr->visit(lookupIdentifierVisitor);
            isReset = lookupIdentifierVisitor.found();

            if (isReset) {
                if (condition.expr->kind == ExpressionKind::UnaryOp) {
                    auto op = condition.expr->as<UnaryExpression>().op;
                    isResetNeg = (op == UnaryOperator::BitwiseNot) ||
                                 (op == UnaryOperator::LogicalNot);
                }
                break;
            }
        }

        if (!isReset)
            return;

        auto resetStatement = &statement.ifTrue;
        auto noResetStatement = statement.ifFalse;

        bool swapStatements = isResetNeg ? !resetIsActiveHigh : resetIsActiveHigh;

        if (swapStatements) {
            std::swap(resetStatement, noResetStatement);
        }

        LookupLhsIdentifier visitor(name);
        noResetStatement->visit(visitor);
        if (visitor.found()) {
            auto foundLocation = visitor.foundLocation();
            visitor.reset();
            resetStatement->visit(visitor);
            if (!visitor.found()) {
                correctlyAssignedOnIfReset = true;
                errorLocation = foundLocation;
            }
        }
    }